

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O1

char * nhr_request_http_headers(_nhr_map_node *map,size_t *length)

{
  int iVar1;
  size_t size;
  char *pcVar2;
  char *__format;
  ulong uVar3;
  
  size = nhr_request_map_strings_length(map,4);
  if (size == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)nhr_malloc(size);
    if (map == (_nhr_map_node *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        __format = "\r\n%s: %s";
        if (uVar3 == 0) {
          __format = "%s: %s";
        }
        iVar1 = sprintf(pcVar2 + uVar3,__format,map->key,(map->value).data);
        uVar3 = uVar3 + (long)iVar1;
        map = map->next;
      } while (map != (_nhr_map_node_struct *)0x0);
    }
    if (size <= uVar3) {
      __assert_fail("writed < buff_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_method_common.c"
                    ,0x35,"char *nhr_request_http_headers(_nhr_map_node *, size_t *)");
    }
    pcVar2[uVar3] = '\0';
    *length = uVar3;
  }
  return pcVar2;
}

Assistant:

char * nhr_request_http_headers(_nhr_map_node * map, size_t * length) {
	const size_t buff_size = nhr_request_map_strings_length(map, 4); // "\r\n" + ": "
	size_t writed = 0;
	_nhr_map_node * cur = map;
	char * buff = NULL;

	if (buff_size == 0) {
		return NULL;
	}
	buff = (char *)nhr_malloc(buff_size); // null terminated included
	
	while (cur) {
		writed += nhr_sprintf(buff + writed, buff_size - writed, writed > 0 ? "\r\n%s: %s" : "%s: %s", cur->key, cur->value.string);
		cur = cur->next;
	}
	assert(writed < buff_size);
	buff[writed] = 0;
	*length = writed;
	return buff;
}